

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote-control.cpp
# Opt level: O1

int main(void)

{
  size_type sVar1;
  bool bVar2;
  int iVar3;
  motor *pmVar4;
  int *piVar5;
  large_motor rmotor;
  large_motor lmotor;
  touch_sensor ts;
  remote_control rc;
  _Any_data local_268;
  code *local_258;
  code *pcStack_250;
  string local_240;
  string local_220;
  address_type local_200;
  address_type local_1e0;
  motor local_1c0;
  address_type local_198;
  motor local_178;
  touch_sensor local_150;
  remote_control local_110;
  
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"ev3-ports:outB","");
  ev3dev::large_motor::large_motor((large_motor *)&local_178,&local_198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"ev3-ports:outC","");
  ev3dev::large_motor::large_motor((large_motor *)&local_1c0,&local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  ev3dev::remote_control::remote_control(&local_110,1);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_200,ev3dev::INPUT_AUTO_abi_cxx11_,
             DAT_0011c4d8 + ev3dev::INPUT_AUTO_abi_cxx11_);
  ev3dev::touch_sensor::touch_sensor(&local_150,&local_200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p);
  }
  local_268._M_unused._M_object = &local_258;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,"Motor on outB is not connected","");
  precondition(local_178.super_device._path._M_string_length != 0,(string *)&local_268);
  if ((code **)local_268._M_unused._0_8_ != &local_258) {
    operator_delete(local_268._M_unused._M_object);
  }
  local_268._M_unused._M_object = &local_258;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,"Motor on outC is not connected","");
  precondition(local_1c0.super_device._path._M_string_length != 0,(string *)&local_268);
  if ((code **)local_268._M_unused._0_8_ != &local_258) {
    operator_delete(local_268._M_unused._M_object);
  }
  sVar1 = ((local_110._sensor)->super_sensor).super_device._path._M_string_length;
  local_268._M_unused._M_object = &local_258;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,"Infrared sensor is not connected","");
  precondition(sVar1 != 0,(string *)&local_268);
  if ((code **)local_268._M_unused._0_8_ != &local_258) {
    operator_delete(local_268._M_unused._M_object);
  }
  local_268._M_unused._M_object = &local_258;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,"Touch sensor is not connected","");
  precondition(local_150.super_sensor.super_device._path._M_string_length != 0,(string *)&local_268)
  ;
  if ((code **)local_268._M_unused._0_8_ != &local_258) {
    operator_delete(local_268._M_unused._M_object);
  }
  local_258 = (code *)0x0;
  pcStack_250 = (code *)0x0;
  local_268._M_unused._M_object = (void *)0x0;
  local_268._8_8_ = 0;
  local_268._M_unused._M_object = operator_new(0x18);
  *(motor **)local_268._M_unused._0_8_ = &local_178;
  *(undefined1 **)((long)local_268._M_unused._0_8_ + 8) = ev3dev::led::left;
  *(undefined4 *)((long)local_268._M_unused._0_8_ + 0x10) = 1;
  pcStack_250 = std::
                _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ddemidov[P]ev3dev-lang-cpp/demos/remote-control.cpp:48:12)>
                ::_M_invoke;
  local_258 = std::
              _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ddemidov[P]ev3dev-lang-cpp/demos/remote-control.cpp:48:12)>
              ::_M_manager;
  std::function<void_(bool)>::operator=(&local_110.on_red_up,(function<void_(bool)> *)&local_268);
  if (local_258 != (code *)0x0) {
    (*local_258)(&local_268,&local_268,3);
  }
  local_258 = (code *)0x0;
  pcStack_250 = (code *)0x0;
  local_268._M_unused._M_object = (void *)0x0;
  local_268._8_8_ = 0;
  local_268._M_unused._M_object = operator_new(0x18);
  *(motor **)local_268._M_unused._0_8_ = &local_178;
  *(undefined1 **)((long)local_268._M_unused._0_8_ + 8) = ev3dev::led::left;
  *(undefined4 *)((long)local_268._M_unused._0_8_ + 0x10) = 0xffffffff;
  pcStack_250 = std::
                _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ddemidov[P]ev3dev-lang-cpp/demos/remote-control.cpp:48:12)>
                ::_M_invoke;
  local_258 = std::
              _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ddemidov[P]ev3dev-lang-cpp/demos/remote-control.cpp:48:12)>
              ::_M_manager;
  std::function<void_(bool)>::operator=(&local_110.on_red_down,(function<void_(bool)> *)&local_268);
  if (local_258 != (code *)0x0) {
    (*local_258)(&local_268,&local_268,3);
  }
  local_258 = (code *)0x0;
  pcStack_250 = (code *)0x0;
  local_268._M_unused._M_object = (void *)0x0;
  local_268._8_8_ = 0;
  local_268._M_unused._M_object = operator_new(0x18);
  *(motor **)local_268._M_unused._0_8_ = &local_1c0;
  *(undefined1 **)((long)local_268._M_unused._0_8_ + 8) = ev3dev::led::right;
  *(undefined4 *)((long)local_268._M_unused._0_8_ + 0x10) = 1;
  pcStack_250 = std::
                _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ddemidov[P]ev3dev-lang-cpp/demos/remote-control.cpp:48:12)>
                ::_M_invoke;
  local_258 = std::
              _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ddemidov[P]ev3dev-lang-cpp/demos/remote-control.cpp:48:12)>
              ::_M_manager;
  std::function<void_(bool)>::operator=(&local_110.on_blue_up,(function<void_(bool)> *)&local_268);
  if (local_258 != (code *)0x0) {
    (*local_258)(&local_268,&local_268,3);
  }
  local_258 = (code *)0x0;
  pcStack_250 = (code *)0x0;
  local_268._M_unused._M_object = (void *)0x0;
  local_268._8_8_ = 0;
  local_268._M_unused._M_object = operator_new(0x18);
  *(motor **)local_268._M_unused._0_8_ = &local_1c0;
  *(undefined1 **)((long)local_268._M_unused._0_8_ + 8) = ev3dev::led::right;
  *(undefined4 *)((long)local_268._M_unused._0_8_ + 0x10) = 0xffffffff;
  pcStack_250 = std::
                _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ddemidov[P]ev3dev-lang-cpp/demos/remote-control.cpp:48:12)>
                ::_M_invoke;
  local_258 = std::
              _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ddemidov[P]ev3dev-lang-cpp/demos/remote-control.cpp:48:12)>
              ::_M_manager;
  std::function<void_(bool)>::operator=(&local_110.on_blue_down,(function<void_(bool)> *)&local_268)
  ;
  if (local_258 != (code *)0x0) {
    (*local_258)(&local_268,&local_268,3);
  }
  do {
    bVar2 = ev3dev::button::pressed((button *)ev3dev::button::enter);
    if (bVar2) {
      if (local_150.super_sensor._bin_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_150.super_sensor._bin_data.
                        super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150.super_sensor.super_device._path._M_dataplus._M_p !=
          &local_150.super_sensor.super_device._path.field_2) {
        operator_delete(local_150.super_sensor.super_device._path._M_dataplus._M_p);
      }
      ev3dev::remote_control::~remote_control(&local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0.super_device._path._M_dataplus._M_p != &local_1c0.super_device._path.field_2)
      {
        operator_delete(local_1c0.super_device._path._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178.super_device._path._M_dataplus._M_p != &local_178.super_device._path.field_2)
      {
        operator_delete(local_178.super_device._path._M_dataplus._M_p);
      }
      return 0;
    }
    ev3dev::remote_control::process(&local_110);
    bVar2 = ev3dev::touch_sensor::is_pressed(&local_150,true);
    if (bVar2) {
      local_268._M_unused._M_object = &local_258;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"Oops, excuse me!","");
      ev3dev::sound::speak((string *)&local_268,false);
      if ((code **)local_268._M_unused._0_8_ != &local_258) {
        operator_delete(local_268._M_unused._M_object);
      }
      local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"brake","");
      pmVar4 = ev3dev::motor::set_stop_action(&local_178,&local_220);
      ev3dev::motor::stop(pmVar4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p);
      }
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"brake","");
      pmVar4 = ev3dev::motor::set_stop_action(&local_1c0,&local_240);
      ev3dev::motor::stop(pmVar4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p);
      }
      ev3dev::led::set_color
                ((vector<ev3dev::led_*,_std::allocator<ev3dev::led_*>_> *)ev3dev::led::left,
                 (vector<float,_std::allocator<float>_> *)ev3dev::led::red);
      ev3dev::led::set_color
                ((vector<ev3dev::led_*,_std::allocator<ev3dev::led_*>_> *)ev3dev::led::right,
                 (vector<float,_std::allocator<float>_> *)ev3dev::led::red);
      pmVar4 = ev3dev::motor::set_time_sp(&local_178,500);
      pmVar4 = ev3dev::motor::set_speed_sp(pmVar4,-900);
      ev3dev::motor::run_timed(pmVar4);
      pmVar4 = ev3dev::motor::set_time_sp(&local_1c0,500);
      pmVar4 = ev3dev::motor::set_speed_sp(pmVar4,-900);
      ev3dev::motor::run_timed(pmVar4);
      local_268._M_unused._M_object = (void *)0x0;
      local_268._8_8_ = 500000000;
      do {
        iVar3 = nanosleep((timespec *)&local_268,(timespec *)&local_268);
        if (iVar3 != -1) break;
        piVar5 = __errno_location();
      } while (*piVar5 == 4);
      ev3dev::led::all_off();
    }
    local_268._M_unused._M_object = (undefined8 *)0x0;
    local_268._8_8_ = 10000000;
    do {
      iVar3 = nanosleep((timespec *)&local_268,(timespec *)&local_268);
      if (iVar3 != -1) break;
      piVar5 = __errno_location();
    } while (*piVar5 == 4);
  } while( true );
}

Assistant:

int main() {
    ev3::large_motor lmotor(ev3::OUTPUT_B);
    ev3::large_motor rmotor(ev3::OUTPUT_C);
    ev3::remote_control rc;
    ev3::touch_sensor   ts;

    precondition(lmotor.connected(), "Motor on outB is not connected");
    precondition(rmotor.connected(), "Motor on outC is not connected");
    precondition(rc.connected(),     "Infrared sensor is not connected");
    precondition(ts.connected(),     "Touch sensor is not connected");

    rc.on_red_up    = roll(lmotor, ev3::led::left,   1);
    rc.on_red_down  = roll(lmotor, ev3::led::left,  -1);
    rc.on_blue_up   = roll(rmotor, ev3::led::right,  1);
    rc.on_blue_down = roll(rmotor, ev3::led::right, -1);

    // Enter event processing loop
    while (!ev3::button::enter.pressed()) {
        rc.process();

        // Backup when an obstacle is bumped
        if (ts.is_pressed()) {
            ev3::sound::speak("Oops, excuse me!");

            lmotor.set_stop_action("brake").stop();
            rmotor.set_stop_action("brake").stop();

            // Turn red lights on
            ev3::led::set_color(ev3::led::left,  ev3::led::red);
            ev3::led::set_color(ev3::led::right, ev3::led::red);

            // Run both motors backwards for 0.5 seconds
            lmotor.set_time_sp(500).set_speed_sp(-900).run_timed();
            rmotor.set_time_sp(500).set_speed_sp(-900).run_timed();

            // Wait 0.5 seconds while motors are rolling
            std::this_thread::sleep_for(std::chrono::milliseconds(500));

            ev3::led::all_off();
        }

        std::this_thread::sleep_for(std::chrono::milliseconds(10));
    }
}